

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::verifyCore(Federate *this)

{
  int iVar1;
  RegistrationFailure *pRVar2;
  string_view message_00;
  string_view message_01;
  string message;
  
  iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Core[7])();
  if ((char)iVar1 == '\0') {
    (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Core[6])();
    iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_Core[7])();
    if ((char)iVar1 == '\0') {
      iVar1 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[9])();
      if ((char)iVar1 != '\0') {
        (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Core[0x11])(&message);
        (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Core[8])();
        pRVar2 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
        message_00._M_str = message._M_dataplus._M_p;
        message_00._M_len = message._M_string_length;
        RegistrationFailure::RegistrationFailure(pRVar2,message_00);
        __cxa_throw(pRVar2,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
      }
      (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Core[8])();
      pRVar2 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_01._M_str = "Unable to connect to broker->unable to register federate";
      message_01._M_len = 0x38;
      RegistrationFailure::RegistrationFailure(pRVar2,message_01);
      __cxa_throw(pRVar2,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
  }
  return;
}

Assistant:

void Federate::verifyCore()
{
    /** make sure the core is connected */
    if (!coreObject->isConnected()) {
        coreObject->connect();
        if (!coreObject->isConnected()) {
            if (coreObject->hasError()) {
                auto message = coreObject->getErrorMessage();
                coreObject->disconnect();
                throw(RegistrationFailure(message));
            }
            coreObject->disconnect();
            throw(RegistrationFailure("Unable to connect to broker->unable to register federate"));
        }
    }
}